

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O0

int ASN1_object_size(int constructed,int length,int tag)

{
  undefined4 local_20;
  undefined4 local_1c;
  int tmplen;
  int ret;
  int tag_local;
  int length_local;
  int constructed_local;
  
  local_1c = 1;
  if (length < 0) {
    length_local = -1;
  }
  else {
    tmplen = tag;
    if (0x1e < tag) {
      for (; 0 < tmplen; tmplen = tmplen >> 7) {
        local_1c = local_1c + 1;
      }
    }
    if (constructed == 2) {
      local_1c = local_1c + 3;
    }
    else {
      local_1c = local_1c + 1;
      local_20 = length;
      if (0x7f < length) {
        for (; 0 < local_20; local_20 = local_20 >> 8) {
          local_1c = local_1c + 1;
        }
      }
    }
    if (local_1c < 0x7fffffff - length) {
      length_local = local_1c + length;
    }
    else {
      length_local = -1;
    }
  }
  return length_local;
}

Assistant:

int ASN1_object_size(int constructed, int length, int tag) {
  int ret = 1;
  if (length < 0) {
    return -1;
  }
  if (tag >= 31) {
    while (tag > 0) {
      tag >>= 7;
      ret++;
    }
  }
  if (constructed == 2) {
    ret += 3;
  } else {
    ret++;
    if (length > 127) {
      int tmplen = length;
      while (tmplen > 0) {
        tmplen >>= 8;
        ret++;
      }
    }
  }
  if (ret >= INT_MAX - length) {
    return -1;
  }
  return ret + length;
}